

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidSchema.cc
# Opt level: O3

bool avro::validate(NodePtr *node,SymbolMap *symbolMap)

{
  pointer this;
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Name *__k;
  iterator iVar5;
  Exception *pEVar6;
  undefined4 extraout_var_00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar8;
  shared_ptr<avro::NodeSymbolic> symNode;
  Type local_12c;
  put_holder<char,_std::char_traits<char>_> local_128;
  undefined1 local_110 [16];
  undefined1 local_100 [208];
  undefined4 extraout_var;
  
  iVar3 = (*node->px->_vptr_Node[0xb])();
  if ((char)iVar3 == '\0') {
    pEVar6 = (Exception *)__cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
               "Schema is invalid, due to bad node of type %1%");
    local_12c = node->px->type_;
    local_128.arg = &local_12c;
    local_128.put_head =
         boost::io::detail::call_put_head<char,std::char_traits<char>,avro::Type_const>;
    local_128.put_last =
         boost::io::detail::call_put_last<char,std::char_traits<char>,avro::Type_const>;
    pbVar7 = boost::io::detail::
             feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                       ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_110,&local_128);
    Exception::Exception(pEVar6,pbVar7);
    __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
  }
  iVar3 = (*node->px->_vptr_Node[2])();
  if ((char)iVar3 != '\0') {
    iVar3 = (*node->px->_vptr_Node[3])();
    __k = (Name *)CONCAT44(extraout_var,iVar3);
    iVar5 = std::
            _Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
            ::find(&symbolMap->_M_t,__k);
    if ((_Rb_tree_header *)iVar5._M_node == &(symbolMap->_M_t)._M_impl.super__Rb_tree_header) {
      if (node->px->type_ == AVRO_NUM_TYPES) goto LAB_00151fe8;
    }
    else {
      bVar2 = Name::operator==(__k,(Name *)(iVar5._M_node + 1));
      this = (pointer)node->px;
      if (*(Type *)&(this->res_)._M_dataplus._M_p == AVRO_NUM_TYPES) {
        if (bVar2) {
          local_110._8_8_ = (node->pn).pi_;
          if ((pointer)local_110._8_8_ != (pointer)0x0) {
            LOCK();
            *(uint_least32_t *)&(((pointer)local_110._8_8_)->res_)._M_dataplus._M_p =
                 *(uint_least32_t *)&(((pointer)local_110._8_8_)->res_)._M_dataplus._M_p + 1;
            UNLOCK();
          }
          local_110._0_8_ = this;
          bVar2 = NodeSymbolic::isSet((NodeSymbolic *)this);
          boost::detail::shared_count::~shared_count((shared_count *)(local_110 + 8));
          return bVar2;
        }
LAB_00151fe8:
        pEVar6 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                   "Symbolic name \"%1%\" is unknown");
        iVar3 = (*node->px->_vptr_Node[3])();
        local_128.arg = (void *)CONCAT44(extraout_var_00,iVar3);
        local_128.put_head =
             boost::io::detail::call_put_head<char,std::char_traits<char>,avro::Name_const>;
        local_128.put_last =
             boost::io::detail::call_put_last<char,std::char_traits<char>,avro::Name_const>;
        pbVar7 = boost::io::detail::
                 feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                           ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_110,&local_128);
        Exception::Exception(pEVar6,pbVar7);
        __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
      }
      if (bVar2) {
        return false;
      }
    }
    std::pair<avro::Name,_boost::shared_ptr<avro::Node>_>::
    pair<avro::Name,_boost::shared_ptr<avro::Node>,_true>
              ((pair<avro::Name,_boost::shared_ptr<avro::Node>_> *)local_110,__k,node);
    std::
    _Rb_tree<avro::Name,std::pair<avro::Name_const,boost::shared_ptr<avro::Node>>,std::_Select1st<std::pair<avro::Name_const,boost::shared_ptr<avro::Node>>>,std::less<avro::Name>,std::allocator<std::pair<avro::Name_const,boost::shared_ptr<avro::Node>>>>
    ::_M_emplace_hint_unique<std::pair<avro::Name,boost::shared_ptr<avro::Node>>>
              ((_Rb_tree<avro::Name,std::pair<avro::Name_const,boost::shared_ptr<avro::Node>>,std::_Select1st<std::pair<avro::Name_const,boost::shared_ptr<avro::Node>>>,std::less<avro::Name>,std::allocator<std::pair<avro::Name_const,boost::shared_ptr<avro::Node>>>>
                *)symbolMap,(const_iterator)iVar5._M_node,
               (pair<avro::Name,_boost::shared_ptr<avro::Node>_> *)local_110);
    boost::detail::shared_count::~shared_count((shared_count *)(local_100 + 0x38));
    if ((undefined1 *)local_100._16_8_ != local_100 + 0x20) {
      operator_delete((void *)local_100._16_8_,local_100._32_8_ + 1);
    }
    if ((pointer)local_110._0_8_ != (pointer)local_100) {
      operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
    }
  }
  peVar1 = node->px;
  peVar1->locked_ = true;
  iVar3 = (*peVar1->_vptr_Node[4])();
  if (CONCAT44(extraout_var_01,iVar3) != 0) {
    uVar8 = 0;
    do {
      iVar4 = (*node->px->_vptr_Node[5])(node->px,uVar8 & 0xffffffff);
      bVar2 = validate((NodePtr *)CONCAT44(extraout_var_02,iVar4),symbolMap);
      if (!bVar2) {
        peVar1 = node->px;
        iVar4 = (*((NodePtr *)CONCAT44(extraout_var_02,iVar4))->px->_vptr_Node[3])();
        iVar5 = std::
                _Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                ::find(&symbolMap->_M_t,(key_type *)CONCAT44(extraout_var_03,iVar4));
        (*peVar1->_vptr_Node[0xf])(peVar1,uVar8 & 0xffffffff,iVar5._M_node + 3);
      }
      uVar8 = uVar8 + 1;
    } while (CONCAT44(extraout_var_01,iVar3) != uVar8);
  }
  return true;
}

Assistant:

static bool validate(const NodePtr &node, SymbolMap &symbolMap) 
{
    if (! node->isValid()) {
        throw Exception(format("Schema is invalid, due to bad node of type %1%")
            % node->type());
    }

    if (node->hasName()) {
        const Name& nm = node->name();
        SymbolMap::iterator it = symbolMap.find(nm);
        bool found = it != symbolMap.end() && nm == it->first;

        if (node->type() == AVRO_SYMBOLIC) {
            if (! found) {
                throw Exception(format("Symbolic name \"%1%\" is unknown") %
                    node->name());
            }

            shared_ptr<NodeSymbolic> symNode =
                static_pointer_cast<NodeSymbolic>(node);

            // if the symbolic link is already resolved, we return true,
            // otherwise returning false will force it to be resolved
            return symNode->isSet();
        }

        if (found) {
            return false;
        }
        symbolMap.insert(it, make_pair(nm, node));
    }

    node->lock();
    size_t leaves = node->leaves();
    for (size_t i = 0; i < leaves; ++i) {
        const NodePtr &leaf(node->leafAt(i));

        if (! validate(leaf, symbolMap)) {

            // if validate returns false it means a node with this name already
            // existed in the map, instead of keeping this node twice in the
            // map (which could potentially create circular shared pointer
            // links that could not be easily freed), replace this node with a
            // symbolic link to the original one.
            
            node->setLeafToSymbolic(i, symbolMap.find(leaf->name())->second);
        }
    }

    return true;
}